

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

void cp_errmsg(CPState *cp,CPToken tok,ErrMsg em,...)

{
  uint uVar1;
  lua_State *L;
  char in_AL;
  char *pcVar2;
  char *msg;
  uint uVar3;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list argp;
  __va_list_tag local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  if (tok == 0) {
    pcVar2 = (char *)0x0;
  }
  else if (tok < 0x10d && 2 < tok - 0x100U) {
    pcVar2 = cp_tok2str(cp,tok);
  }
  else {
    if ((cp->sb).n == 0) {
      if ((cp->sb).sz == 0) {
        cp_save_grow(cp,0x24);
      }
      else {
        (cp->sb).n = 1;
        *(cp->sb).buf = '$';
      }
    }
    uVar1 = (cp->sb).n;
    uVar3 = uVar1 + 1;
    if ((cp->sb).sz < uVar3) {
      cp_save_grow(cp,0);
    }
    else {
      (cp->sb).n = uVar3;
      (cp->sb).buf[uVar1] = '\0';
    }
    pcVar2 = (cp->sb).buf;
  }
  L = cp->L;
  local_f8.reg_save_area = local_d8;
  local_f8.overflow_arg_area = &argp[0].overflow_arg_area;
  local_f8.gp_offset = 0x18;
  local_f8.fp_offset = 0x30;
  msg = lj_str_pushvf(L,lj_err_allmsg + em,&local_f8);
  if (pcVar2 != (char *)0x0) {
    msg = lj_str_pushf(L,lj_err_allmsg + 0x8c4,msg,pcVar2);
  }
  if (1 < cp->linenumber) {
    msg = lj_str_pushf(L,"%s at line %d",msg);
  }
  lj_err_callermsg(L,msg);
}

Assistant:

LJ_NORET static void cp_errmsg(CPState *cp, CPToken tok, ErrMsg em, ...)
{
  const char *msg, *tokstr;
  lua_State *L;
  va_list argp;
  if (tok == 0) {
    tokstr = NULL;
  } else if (tok == CTOK_IDENT || tok == CTOK_INTEGER || tok == CTOK_STRING ||
	     tok >= CTOK_FIRSTDECL) {
    if (cp->sb.n == 0) cp_save(cp, '$');
    cp_save(cp, '\0');
    tokstr = cp->sb.buf;
  } else {
    tokstr = cp_tok2str(cp, tok);
  }
  L = cp->L;
  va_start(argp, em);
  msg = lj_str_pushvf(L, err2msg(em), argp);
  va_end(argp);
  if (tokstr)
    msg = lj_str_pushf(L, err2msg(LJ_ERR_XNEAR), msg, tokstr);
  if (cp->linenumber > 1)
    msg = lj_str_pushf(L, "%s at line %d", msg, cp->linenumber);
  lj_err_callermsg(L, msg);
}